

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_statistics.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::TableStatistics::CopyStats(TableStatistics *this,idx_t i)

{
  bool bVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  reference pvVar3;
  ColumnStatistics *pCVar4;
  BaseStatistics *this_00;
  DistinctStatistics *this_01;
  idx_t count;
  size_type in_RDX;
  vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *this_02;
  BaseStatistics result;
  BaseStatistics BStack_78;
  
  __mutex = (pthread_mutex_t *)
            shared_ptr<std::mutex,_true>::operator*((shared_ptr<std::mutex,_true> *)i);
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    this_02 = (vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true> *)(i + 0x10);
    pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                       (this_02,in_RDX);
    pCVar4 = shared_ptr<duckdb::ColumnStatistics,_true>::operator->(pvVar3);
    this_00 = ColumnStatistics::Statistics(pCVar4);
    BaseStatistics::Copy(&BStack_78,this_00);
    pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                       (this_02,in_RDX);
    pCVar4 = shared_ptr<duckdb::ColumnStatistics,_true>::operator->(pvVar3);
    bVar1 = ColumnStatistics::HasDistinctStats(pCVar4);
    if (bVar1) {
      pvVar3 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                         (this_02,in_RDX);
      pCVar4 = shared_ptr<duckdb::ColumnStatistics,_true>::operator->(pvVar3);
      this_01 = ColumnStatistics::DistinctStats(pCVar4);
      count = DistinctStatistics::GetCount(this_01);
      BaseStatistics::SetDistinctCount(&BStack_78,count);
    }
    BaseStatistics::ToUnique((BaseStatistics *)this);
    BaseStatistics::~BaseStatistics(&BStack_78);
    pthread_mutex_unlock(__mutex);
    return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
  }
  ::std::__throw_system_error(iVar2);
}

Assistant:

unique_ptr<BaseStatistics> TableStatistics::CopyStats(idx_t i) {
	lock_guard<mutex> l(*stats_lock);
	auto result = column_stats[i]->Statistics().Copy();
	if (column_stats[i]->HasDistinctStats()) {
		result.SetDistinctCount(column_stats[i]->DistinctStats().GetCount());
	}
	return result.ToUnique();
}